

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseVia(LEFReader *this)

{
  bool bVar1;
  __type_conflict _Var2;
  token_t tVar3;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined4 local_70;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string viaName;
  LEFReader *this_local;
  
  viaName.field_2._8_8_ = this;
  tVar3 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar3;
  std::__cxx11::string::string((string *)local_38);
  if (this->m_curtok == TOK_IDENT) {
    std::__cxx11::string::operator=((string *)local_38,(string *)&this->m_tokstr);
    do {
      tVar3 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar3;
      while( true ) {
        bVar1 = std::operator!=(&this->m_tokstr,"END");
        if (!bVar1) break;
        tVar3 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar3;
      }
      tVar3 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar3;
      if (this->m_curtok != TOK_IDENT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Expected via name after END\n",&local_91);
        error(this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        this_local._7_1_ = false;
        goto LAB_001690e9;
      }
      _Var2 = std::operator==(&this->m_tokstr,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38);
    } while (_Var2);
    tVar3 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar3;
    if (this->m_curtok == TOK_EOL) {
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Expected EOL after END <vianame>\n",&local_b9);
      error(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Expected identifier in via name\n",&local_59);
    error(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    this_local._7_1_ = false;
  }
LAB_001690e9:
  local_70 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseVia()
{
    // VIA <vianame> ...
    // keep on reading tokens until we
    // find END <vianame>

    m_curtok = tokenize(m_tokstr);
    std::string viaName;

    if (m_curtok != TOK_IDENT)
    {
        error("Expected identifier in via name\n");
        return false;
    }

    viaName = m_tokstr;

    // read until we get END <vianame>
    do
    {
        m_curtok = tokenize(m_tokstr);
        while(m_tokstr != "END")
        {
            m_curtok = tokenize(m_tokstr);
        }

        // read via name
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_IDENT)
        {
            error("Expected via name after END\n");
            return false;
        }
    } while(m_tokstr == viaName);
    
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after END <vianame>\n");
        return false;
    }

    return true;
}